

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O1

void __thiscall RandomSO3IsInM::test_method(RandomSO3IsInM *this)

{
  long lVar1;
  undefined **ppuVar2;
  int iVar3;
  long lVar4;
  Index size;
  SO3<mnf::ExpMapQuaternion> S;
  Point y;
  shared_count sStack_290;
  char *local_288;
  char *local_280;
  undefined **local_278;
  undefined1 local_270;
  undefined7 uStack_26f;
  undefined8 *local_268;
  char **local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  SO3<mnf::ExpMapQuaternion> local_1f8;
  void *local_150;
  ConstSubPoint local_140 [272];
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&local_1f8);
  mnf::Manifold::createRandomPoint(1.0);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x5b);
  mnf::Point::isInM(1e-12);
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_288 = "y.isInM()";
  local_280 = "";
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_00135b88;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_220 = "";
  local_260 = &local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  lVar4 = mnf::Manifold::representationDim();
  if (lVar4 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  mnf::SubPoint::value();
  ppuVar2 = local_278;
  lVar1 = CONCAT71(uStack_26f,local_270);
  if (lVar1 == lVar4) {
    if (0 < lVar1) {
      lVar4 = 0;
      do {
        iVar3 = rand();
        ppuVar2[lVar4] = (undefined *)(((double)iVar3 + (double)iVar3) / 2147483647.0 + -1.0);
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
    local_238 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
    ;
    local_230 = "";
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x5d);
    mnf::Point::isInM(1e-12);
    sStack_290.pi_ = (sp_counted_base *)0x0;
    local_288 = "!y.isInM()";
    local_280 = "";
    local_270 = 0;
    local_278 = &PTR__lazy_ostream_00135b88;
    local_268 = &boost::unit_test::lazy_ostream::inst;
    local_258 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
    ;
    local_250 = "";
    local_260 = &local_288;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_290);
    mnf::ConstSubPoint::~ConstSubPoint(local_140);
    free(local_150);
    local_1f8._0_8_ = &PTR__SO3_00135670;
    mnf::ReusableTemporaryMap::~ReusableTemporaryMap
              ((ReusableTemporaryMap *)((long)&local_1f8 + 0x58));
    mnf::Manifold::~Manifold(&local_1f8.super_Manifold);
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomSO3IsInM)
{
  SO3<ExpMapQuaternion> S;
  Point y = S.createRandomPoint();
  BOOST_CHECK(y.isInM());
  y.value() = Eigen::VectorXd::Random(S.representationDim());
  BOOST_CHECK(!y.isInM());
}